

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::NewScObjectCommon
              (RecyclableObject *function,FunctionInfo *functionInfo,ScriptContext *requestContext,
              bool isBaseClassConstructorNewScObject)

{
  Type TVar1;
  ulong uVar2;
  code *pcVar3;
  ScriptContext *pSVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  LocalFunctionId LVar8;
  JavascriptFunction *this;
  undefined4 *puVar9;
  DynamicObject *pDVar10;
  FunctionProxy *this_00;
  ParseableFunctionInfo *this_01;
  FunctionBody *this_02;
  RecyclableObject *pRVar11;
  RecyclableObject *pRVar12;
  Var aValue;
  DynamicTypeHandler *pDVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char16 *pcVar14;
  char16_t *pcVar15;
  ConstructorCache *pCVar16;
  undefined4 extraout_var_01;
  char16_t *pcVar17;
  char16_t *pcVar18;
  DynamicType *pDVar19;
  ScriptContext *pSVar20;
  bool local_b8 [8];
  bool cachedProtoCanBeCached;
  RecyclableObject *local_58;
  ScriptContext *local_50;
  ConstructorCache *local_48;
  ScriptContext *local_40;
  bool local_32;
  char local_31;
  bool prototypeCanBeCached;
  
  local_40 = requestContext;
  this = UnsafeVarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
  if ((*(byte *)((long)&functionInfo->attributes + 1) >> 2 & !isBaseClassConstructorNewScObject) !=
      0) {
    return function;
  }
  local_48 = JavascriptFunction::GetConstructorCache(this);
  pSVar20 = (local_48->content).scriptContext.ptr;
  if ((pSVar20 != (ScriptContext *)0x0) &&
     (pSVar20 !=
      (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x196e,
                                "(constructorCache->GetScriptContext() == nullptr || constructorCache->GetScriptContext() == constructor->GetScriptContext())"
                                ,
                                "Why did we populate a constructor cache with a mismatched script context?"
                               );
    if (!bVar5) goto LAB_00ac41c4;
    *puVar9 = 0;
  }
  uVar2 = (local_48->super_PropertyGuard).value;
  pDVar19 = (DynamicType *)(uVar2 & 0xfffffffffffffffe);
  if ((pDVar19 != (DynamicType *)0x0) && ((local_48->content).scriptContext.ptr == local_40)) {
    pRVar12 = (pDVar19->super_Type).prototype.ptr;
    pRVar11 = GetPrototypeObjectForConstructorCache((RecyclableObject *)this,local_40,local_b8);
    if (pRVar12 != pRVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1976,
                                  "(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached))"
                                  ,
                                  "type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached)"
                                 );
      if (!bVar5) goto LAB_00ac41c4;
      *puVar9 = 0;
    }
    if (local_b8[0] == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1977,"(cachedProtoCanBeCached)","cachedProtoCanBeCached");
      if (!bVar5) goto LAB_00ac41c4;
      *puVar9 = 0;
    }
    if (pDVar19->isShared == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1978,"(type->GetIsShared())","type->GetIsShared()");
      if (!bVar5) goto LAB_00ac41c4;
      *puVar9 = 0;
    }
    TraceUseConstructorCache(local_48,this,true);
    pDVar10 = DynamicObject::New(local_40->recycler,pDVar19);
    bVar5 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar5) {
      pRVar12 = JavascriptProxy::AutoProxyWrapper(pDVar10);
      pDVar10 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar12);
      return pDVar10;
    }
    return pDVar10;
  }
  if ((uVar2 == 1) && (((local_48->content).field_0x14 & 0x10) != 0)) {
    if ((local_48->content).updateAfterCtor == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x198b,"(!constructorCache->NeedsUpdateAfterCtor())",
                                  "!constructorCache->NeedsUpdateAfterCtor()");
      if (!bVar5) goto LAB_00ac41c4;
      *puVar9 = 0;
    }
    TraceUseConstructorCache(local_48,this,true);
    pSVar20 = local_40;
    if (!isBaseClassConstructorNewScObject) {
      return (Var)0x0;
    }
    pDVar10 = JavascriptLibrary::CreateObject
                        ((local_40->super_ScriptContextBase).javascriptLibrary,false,0);
    OrdinaryCreateFromConstructor
              (function,&pDVar10->super_RecyclableObject,(DynamicObject *)0x0,pSVar20);
    return pDVar10;
  }
  TraceUseConstructorCache(local_48,this,false);
  pSVar20 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  if ((pSVar20->threadContext->disableImplicitFlags & DisableImplicitExceptionFlag) !=
      DisableImplicitNoFlag) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x199d,
                                "(!constructorScriptContext->GetThreadContext()->IsDisableImplicitException())"
                                ,
                                "!constructorScriptContext->GetThreadContext()->IsDisableImplicitException()"
                               );
    if (!bVar5) goto LAB_00ac41c4;
    *puVar9 = 0;
  }
  ScriptContext::VerifyAlive(pSVar20,1,local_40);
  TVar1 = functionInfo->attributes;
  if ((TVar1 & ErrorOnNew) != None) {
    JavascriptError::ThrowTypeError(local_40,-0x7ff5ebf5,(PCWSTR)0x0);
  }
  this_00 = JavascriptFunction::GetFunctionProxy(this);
  if (this_00 == (FunctionProxy *)0x0) {
    this_02 = (FunctionBody *)0x0;
  }
  else {
    this_01 = FunctionProxy::EnsureDeserialized(this_00);
    this_02 = ParseableFunctionInfo::Parse(this_01,(ScriptFunction **)0x0,false);
  }
  if ((TVar1 & SkipDefaultNewObject) != None) {
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ConstructorCachePhase);
    pCVar16 = local_48;
    if (!bVar5) {
      if (this_02 != (FunctionBody *)0x0) {
        uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
        if ((this_02->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar5) goto LAB_00ac41c4;
          *puVar9 = 0;
        }
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ConstructorCachePhase,uVar7,
                                  ((this_02->super_ParseableFunctionInfo).super_FunctionProxy.
                                   functionInfo.ptr)->functionId);
        pCVar16 = local_48;
        if (bVar5) goto LAB_00ac3ff2;
      }
      pCVar16 = JavascriptFunction::EnsureValidConstructorCache(this);
      ConstructorCache::PopulateForSkipDefaultNewObject(pCVar16,pSVar20);
      if (this_02 == (FunctionBody *)0x0) {
LAB_00ac3ebf:
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,ConstructorCachePhase);
        if (!bVar5) goto LAB_00ac3ff2;
      }
      else {
        uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
        if ((this_02->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar5) goto LAB_00ac41c4;
          *puVar9 = 0;
        }
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,ConstructorCachePhase,uVar7,
                                  ((this_02->super_ParseableFunctionInfo).super_FunctionProxy.
                                   functionInfo.ptr)->functionId);
        if (!bVar5) {
          if (this_02 != (FunctionBody *)0x0) goto LAB_00ac3ff2;
          goto LAB_00ac3ebf;
        }
      }
      if (this_02 == (FunctionBody *)0x0) {
        pcVar18 = L"<unknown>";
        pcVar14 = L"(null)";
      }
      else {
        iVar6 = (*(this_02->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_02);
        pcVar18 = (char16_t *)CONCAT44(extraout_var_00,iVar6);
        pcVar14 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)this_02,(wchar (*) [42])local_b8);
      }
      Output::Print(L"CtorCache: populated cache (0x%p) for ctor %s (%s): ",pCVar16,pcVar18,pcVar14)
      ;
      ConstructorCache::Dump(pCVar16);
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_00ac3ff2:
    if ((pCVar16->content).updateAfterCtor == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x19c4,"(!constructorCache->NeedsUpdateAfterCtor())",
                                  "!constructorCache->NeedsUpdateAfterCtor()");
      if (!bVar5) {
LAB_00ac41c4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    return (Var)0x0;
  }
  pRVar12 = GetPrototypeObjectForConstructorCache(function,pSVar20,&local_32);
  pSVar4 = local_40;
  aValue = CrossSite::MarshalVar(local_40,pRVar12,pSVar20);
  local_58 = VarTo<Js::RecyclableObject>(aValue);
  pDVar10 = JavascriptLibrary::CreateObject
                      ((pSVar4->super_ScriptContextBase).javascriptLibrary,local_58,8);
  bVar5 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar5) {
    pRVar12 = JavascriptProxy::AutoProxyWrapper(pDVar10);
    pDVar10 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar12);
  }
  pDVar13 = DynamicObject::GetTypeHandler(pDVar10);
  iVar6 = (*pDVar13->_vptr_DynamicTypeHandler[6])(pDVar13);
  if (iVar6 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x19dc,"(newObject->GetTypeHandler()->GetPropertyCount() == 0)",
                                "newObject->GetTypeHandler()->GetPropertyCount() == 0");
    if (!bVar5) goto LAB_00ac41c4;
    *puVar9 = 0;
  }
  local_31 = local_32;
  if ((((pSVar20 == local_40) && (this_02 != (FunctionBody *)0x0)) && (local_32 != false)) &&
     ((bVar5 = VarIs<Js::JavascriptProxy,Js::DynamicObject>(pDVar10), !bVar5 &&
      (bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ConstructorCachePhase), !bVar5)))) {
    uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
    local_50 = pSVar20;
    LVar8 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
    pSVar20 = local_50;
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ConstructorCachePhase,uVar7,LVar8);
    if (!bVar5) {
      pDVar19 = (DynamicType *)(pDVar10->super_RecyclableObject).type.ptr;
      if (pDVar19->isShared == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x19e4,"(newObjectType->GetIsShared())",
                                    "newObjectType->GetIsShared()");
        if (!bVar5) goto LAB_00ac41c4;
        *puVar9 = 0;
      }
      pCVar16 = JavascriptFunction::EnsureValidConstructorCache(this);
      ConstructorCache::Populate
                (pCVar16,pDVar19,local_50,
                 (bool)(((this_02->super_ParseableFunctionInfo).flags &
                        Flags_HasNoExplicitReturnValue) >> 6),true);
      bVar5 = ConstructorCache::IsConsistent(pCVar16);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x19ed,"(constructorCache->IsConsistent())",
                                    "constructorCache->IsConsistent()");
        if (!bVar5) goto LAB_00ac41c4;
        *puVar9 = 0;
      }
      uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
      LVar8 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_02);
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,ConstructorCachePhase,uVar7,LVar8);
      if (!bVar5) {
        return pDVar10;
      }
      iVar6 = (*(this_02->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_02);
      pcVar14 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_02,(wchar (*) [42])local_b8);
      Output::Print(L"CtorCache: populated cache (0x%p) for ctor %s (%s): ",pCVar16,
                    CONCAT44(extraout_var_01,iVar6),pcVar14);
      ConstructorCache::Dump(pCVar16);
      goto LAB_00ac3f7c;
    }
  }
  if (this_02 == (FunctionBody *)0x0) {
LAB_00ac3d0b:
    if (this_02 != (FunctionBody *)0x0) {
      return pDVar10;
    }
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,ConstructorCachePhase);
    if (!bVar5) {
      return pDVar10;
    }
  }
  else {
    uVar7 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
    if ((this_02->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_00ac41c4;
      *puVar9 = 0;
    }
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,ConstructorCachePhase,uVar7,
                              ((this_02->super_ParseableFunctionInfo).super_FunctionProxy.
                               functionInfo.ptr)->functionId);
    if (!bVar5) goto LAB_00ac3d0b;
  }
  if (this_02 == (FunctionBody *)0x0) {
    pcVar18 = L"<unknown>";
    pcVar14 = L"(null)";
  }
  else {
    iVar6 = (*(this_02->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_02);
    pcVar18 = (char16_t *)CONCAT44(extraout_var,iVar6);
    pcVar14 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_02,(wchar (*) [42])local_b8);
  }
  pcVar17 = L"of cross-context call";
  if (pSVar20 == local_40) {
    pcVar17 = L"constructor cache phase is off";
  }
  pcVar15 = L"function has no body";
  if (this_02 != (FunctionBody *)0x0) {
    pcVar15 = pcVar17;
  }
  pcVar17 = L"prototype cannot be cached";
  if (local_31 != '\0') {
    pcVar17 = pcVar15;
  }
  Output::Print(L"CtorCache: did not populate cache (0x%p) for ctor %s (%s), because %s: prototype = 0x%p, functionBody = 0x%p, ctor context = 0x%p, request context = 0x%p"
                ,local_48,pcVar18,pcVar14,pcVar17,local_58,this_02,pSVar20,local_40);
LAB_00ac3f7c:
  Output::Print(L"\n");
  Output::Flush();
  return pDVar10;
}

Assistant:

Var JavascriptOperators::NewScObjectCommon(RecyclableObject * function, FunctionInfo* functionInfo, ScriptContext * requestContext, bool isBaseClassConstructorNewScObject)
    {
        // CONSIDER: Allow for the cache to be repopulated if the type got collected, and a new one got populated with
        // the same number of inlined slots. This requires that the JIT-ed code actually load the type from the cache
        // (instead of hard-coding it), but it can (and must) keep the hard-coded number of inline slots.
        // CONSIDER: Consider also not pinning the type in the cache.  This can be done by using a registration based
        // weak reference (we need to control the memory address), which we don't yet have, or by allocating the cache from
        // the inline cache arena to allow it to be zeroed, but retain a recycler-allocated portion to hold on to the size of
        // inlined slots.

        JavascriptFunction* constructor = UnsafeVarTo<JavascriptFunction>(function);
        if (functionInfo->IsClassConstructor() && !isBaseClassConstructorNewScObject)
        {
            // If we are calling new on a class constructor, the contract is that we pass new.target as the 'this' argument.
            // function is the constructor on which we called new - which is new.target.
            // If we are trying to construct the object for a base class constructor as part of a super call, we should not
            // store new.target in the 'this' argument.
            return function;
        }
        ConstructorCache* constructorCache = constructor->GetConstructorCache();
        AssertMsg(constructorCache->GetScriptContext() == nullptr || constructorCache->GetScriptContext() == constructor->GetScriptContext(),
            "Why did we populate a constructor cache with a mismatched script context?");

        Assert(constructorCache != nullptr);
        DynamicType* type = constructorCache->GetGuardValueAsType();
        if (type != nullptr && constructorCache->GetScriptContext() == requestContext)
        {
#if DBG
            bool cachedProtoCanBeCached;
            Assert(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached));
            Assert(cachedProtoCanBeCached);
            Assert(type->GetIsShared());
#endif

#if DBG_DUMP
            TraceUseConstructorCache(constructorCache, constructor, true);
#endif
            Var object = DynamicObject::New(requestContext->GetRecycler(), type);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
            }
#endif
            return object;
        }

        if (constructorCache->SkipDefaultNewObject())
        {
            Assert(!constructorCache->NeedsUpdateAfterCtor());

#if DBG_DUMP
            TraceUseConstructorCache(constructorCache, constructor, true);
#endif
            if (isBaseClassConstructorNewScObject)
            {
                return JavascriptOperators::CreateFromConstructor(function, requestContext);
            }

            return nullptr;
        }

#if DBG_DUMP
        TraceUseConstructorCache(constructorCache, constructor, false);
#endif

        ScriptContext* constructorScriptContext = function->GetScriptContext();
        Assert(!constructorScriptContext->GetThreadContext()->IsDisableImplicitException());
        // we shouldn't try to call the constructor if it's closed already.
        constructorScriptContext->VerifyAlive(TRUE, requestContext);

        FunctionInfo::Attributes attributes = functionInfo->GetAttributes();
        if (attributes & FunctionInfo::ErrorOnNew)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnNew);
        }

        // Slow path
        FunctionProxy * ctorProxy = constructor->GetFunctionProxy();
        FunctionBody * functionBody = ctorProxy != nullptr ? ctorProxy->EnsureDeserialized()->Parse() : nullptr;

        if (attributes & FunctionInfo::SkipDefaultNewObject)
        {
            // The constructor doesn't use the default new object.
#pragma prefast(suppress:6236, "DevDiv bug 830883. False positive when PHASE_OFF is #defined as '(false)'.")
            if (!PHASE_OFF1(ConstructorCachePhase) && (functionBody == nullptr || !PHASE_OFF(ConstructorCachePhase, functionBody)))
            {
                constructorCache = constructor->EnsureValidConstructorCache();
                constructorCache->PopulateForSkipDefaultNewObject(constructorScriptContext);

#if DBG_DUMP
                if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
                {
                    const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("CtorCache: populated cache (0x%p) for ctor %s (%s): "), constructorCache, ctorName,
                        functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                    constructorCache->Dump();
                    Output::Print(_u("\n"));
                    Output::Flush();
                }
#endif

            }

            Assert(!constructorCache->NeedsUpdateAfterCtor());
            return nullptr;
        }

        // CONSIDER: Create some form of PatchGetProtoObjForCtorCache, which actually caches the prototype object in the constructor cache.
        // Make sure that it does NOT populate the guard field.  On the slow path (the only path for cross-context calls) we can do a faster lookup
        // after we fail the guard check.  When invalidating the cache for proto change, make sure we zap the prototype field of the cache in
        // addition to the guard value.
        bool prototypeCanBeCached;
        RecyclableObject* prototype = JavascriptOperators::GetPrototypeObjectForConstructorCache(
          function, constructorScriptContext, prototypeCanBeCached);
        prototype = VarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext,
          prototype, constructorScriptContext));

        DynamicObject* newObject = requestContext->GetLibrary()->CreateObject(prototype, 8);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
        }
#endif

        Assert(newObject->GetTypeHandler()->GetPropertyCount() == 0);

        if (prototypeCanBeCached && functionBody != nullptr && requestContext == constructorScriptContext &&
            !Js::VarIs<Js::JavascriptProxy>(newObject) &&
            !PHASE_OFF1(ConstructorCachePhase) && !PHASE_OFF(ConstructorCachePhase, functionBody))
        {
            DynamicType* newObjectType = newObject->GetDynamicType();
            // Initial type (without any properties) should always be shared up-front.  This allows us to populate the cache right away.
            Assert(newObjectType->GetIsShared());

            // Populate the cache here and set the updateAfterCtor flag.  This way, if the ctor is called recursively the
            // recursive calls will hit the cache and use the initial type.  On the unwind path, we will update the cache
            // after the innermost ctor and clear the flag.  After subsequent ctors we won't attempt an update anymore.
            // As long as the updateAfterCtor flag is set it is safe to update the cache, because it would not have been
            // hard-coded in the JIT-ed code.
            constructorCache = constructor->EnsureValidConstructorCache();
            constructorCache->Populate(newObjectType, constructorScriptContext, functionBody->GetHasNoExplicitReturnValue(), true);
            Assert(constructorCache->IsConsistent());

#if DBG_DUMP
            if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
            {
                const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("CtorCache: populated cache (0x%p) for ctor %s (%s): "), constructorCache, ctorName,
                    functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                constructorCache->Dump();
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
        }
        else
        {
#if DBG_DUMP
            if ((functionBody != nullptr && PHASE_TRACE(Js::ConstructorCachePhase, functionBody)) || (functionBody == nullptr && PHASE_TRACE1(Js::ConstructorCachePhase)))
            {
                const char16* ctorName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("CtorCache: did not populate cache (0x%p) for ctor %s (%s), because %s: prototype = 0x%p, functionBody = 0x%p, ctor context = 0x%p, request context = 0x%p"),
                    constructorCache, ctorName, functionBody ? functionBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                    !prototypeCanBeCached ? _u("prototype cannot be cached") :
                    functionBody == nullptr ? _u("function has no body") :
                    requestContext != constructorScriptContext ? _u("of cross-context call") : _u("constructor cache phase is off"),
                    prototype, functionBody, constructorScriptContext, requestContext);
                Output::Print(_u("\n"));
                Output::Flush();
            }
#endif
        }

        return newObject;
    }